

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O1

int __thiscall
NNTreeImpl::binarySearch
          (NNTreeImpl *this,QPDFObjectHandle *key,QPDFObjectHandle *items,int num_items,
          bool return_prev_if_not_found,offset_in_NNTreeImpl_to_subr compare)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  code *pcVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  bool bVar10;
  code *in_stack_00000008;
  long in_stack_00000010;
  uint local_5c;
  
  uVar7 = 1;
  do {
    uVar8 = uVar7;
    uVar6 = (ulong)uVar8;
    uVar7 = uVar8 * 2;
  } while ((int)uVar8 < num_items);
  if ((int)uVar8 < 1) {
    bVar9 = false;
    uVar7 = 0xffffffff;
    bVar2 = false;
  }
  else {
    uVar8 = uVar8 >> 1;
    plVar1 = (long *)((long)&this->details + in_stack_00000010);
    uVar7 = 0xffffffff;
    bVar9 = false;
    bVar2 = false;
    local_5c = uVar8;
    do {
      if ((int)uVar8 < num_items) {
        pcVar4 = in_stack_00000008;
        if (((ulong)in_stack_00000008 & 1) != 0) {
          pcVar4 = *(code **)(in_stack_00000008 + *plVar1 + -1);
        }
        iVar3 = (*pcVar4)(plVar1,key,items,uVar8);
        if (-1 < iVar3) {
          bVar9 = true;
          uVar7 = uVar8;
        }
      }
      else {
        iVar3 = -1;
      }
      if (iVar3 == 0) {
        bVar2 = true;
      }
      else {
        uVar5 = (uint)uVar6;
        uVar6 = uVar6 >> 1;
        if (1 < uVar5) {
          bVar10 = local_5c < 2;
          local_5c = (int)local_5c >> 1;
          if (bVar10) {
            local_5c = 1;
          }
          if (iVar3 < 0) {
            uVar8 = uVar8 - local_5c;
          }
          else {
            uVar8 = uVar8 + local_5c;
          }
        }
      }
    } while ((!bVar2) && (0 < (int)uVar6));
  }
  uVar8 = 0xffffffff;
  if (return_prev_if_not_found) {
    uVar8 = uVar7;
  }
  if (!bVar9) {
    uVar8 = 0xffffffff;
  }
  if (bVar2) {
    uVar8 = uVar7;
  }
  return uVar8;
}

Assistant:

int
NNTreeImpl::binarySearch(
    QPDFObjectHandle key,
    QPDFObjectHandle items,
    int num_items,
    bool return_prev_if_not_found,
    int (NNTreeImpl::*compare)(QPDFObjectHandle& key, QPDFObjectHandle& arr, int item))
{
    int max_idx = 1;
    while (max_idx < num_items) {
        max_idx <<= 1;
    }

    int step = max_idx / 2;
    int checks = max_idx;
    int idx = step;
    int found_idx = -1;
    bool found = false;
    bool found_leq = false;
    int status = 0;

    while ((!found) && (checks > 0)) {
        if (idx < num_items) {
            status = (this->*compare)(key, items, idx);
            if (status >= 0) {
                found_leq = true;
                found_idx = idx;
            }
        } else {
            // consider item to be below anything after the top
            status = -1;
        }

        if (status == 0) {
            found = true;
        } else {
            checks >>= 1;
            if (checks > 0) {
                step >>= 1;
                if (step == 0) {
                    step = 1;
                }

                if (status < 0) {
                    idx -= step;
                } else {
                    idx += step;
                }
            }
        }
    }

    if (found || (found_leq && return_prev_if_not_found)) {
        return found_idx;
    } else {
        return -1;
    }
}